

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall HighsMipSolverData::moreHeuristicsAllowed(HighsMipSolverData *this)

{
  long lVar1;
  bool bVar2;
  double *pdVar3;
  long *in_RDI;
  double dVar4;
  double dVar5;
  double total_heuristic_effort_estim;
  int64_t node_iters_curr_run;
  int64_t sb_iters_curr_run;
  int64_t heur_iters_curr_run;
  double in_stack_ffffffffffffff78;
  HighsCDouble *in_stack_ffffffffffffff80;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  long local_28;
  long local_20;
  long local_18;
  bool local_1;
  
  if ((*(byte *)(*in_RDI + 0xb0) & 1) == 0) {
    bVar2 = HighsCDouble::operator<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (((bVar2) && (in_RDI[0xce7] - in_RDI[0xce8] < 10)) && (in_RDI[0xce6] - in_RDI[0xce9] < 1000))
    {
      if ((double)in_RDI[0xcee] < (double)in_RDI[0xced] * (double)in_RDI[0xcc6] + 10000.0) {
        return true;
      }
    }
    else if (in_RDI[0xcee] < ((in_RDI[0xced] - in_RDI[0xcee]) - in_RDI[0xcf0] >> 1) + 100000) {
      local_18 = in_RDI[0xcee] - in_RDI[0xcf2];
      local_20 = in_RDI[0xcf0] - in_RDI[0xcf4];
      local_28 = ((in_RDI[0xced] - in_RDI[0xcf1]) - local_18) - local_20;
      lVar1 = in_RDI[0xcee];
      dVar4 = (double)(in_RDI[0xced] - local_28);
      dVar5 = (double)local_28;
      local_38 = 0.01;
      local_40 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xce0));
      pdVar3 = std::max<double>(&local_38,&local_40);
      dVar4 = (double)lVar1 / (dVar4 + dVar5 / *pdVar3);
      local_48 = 0.37499999999999994;
      local_30 = dVar4;
      local_58 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xce0));
      local_60 = 0.8;
      pdVar3 = std::min<double>(&local_58,&local_60);
      local_50 = *pdVar3 / 0.8;
      pdVar3 = std::max<double>(&local_48,&local_50);
      if (dVar4 < *pdVar3 * (double)in_RDI[0xcc6]) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = (double)in_RDI[0xcee] < (double)in_RDI[0xced] * (double)in_RDI[0xcc6];
  }
  return local_1;
}

Assistant:

bool HighsMipSolverData::moreHeuristicsAllowed() const {
  // in the beginning of the search and in sub-MIP heuristics we only allow
  // what is proportionally for the currently spent effort plus an initial
  // offset. This is because in a sub-MIP we usually do a truncated search and
  // therefore should not extrapolate the time we spent for heuristics as in
  // the other case. Moreover, since we estimate the total effort for
  // exploring the tree based on the weight of the already pruned nodes, the
  // estimated effort the is not expected to be a good prediction in the
  // beginning.
  if (mipsolver.submip) {
    return heuristic_lp_iterations < total_lp_iterations * heuristic_effort;
  } else if (pruned_treeweight < 1e-3 &&
             num_leaves - num_leaves_before_run < 10 &&
             num_nodes - num_nodes_before_run < 1000) {
    // in the main MIP solver allow an initial offset of 10000 heuristic LP
    // iterations
    if (heuristic_lp_iterations <
        total_lp_iterations * heuristic_effort + 10000)
      return true;
  } else if (heuristic_lp_iterations <
             100000 + ((total_lp_iterations - heuristic_lp_iterations -
                        sb_lp_iterations) >>
                       1)) {
    // compute the node LP iterations in the current run as only those should be
    // used when estimating the total required LP iterations to complete the
    // search
    int64_t heur_iters_curr_run =
        heuristic_lp_iterations - heuristic_lp_iterations_before_run;
    int64_t sb_iters_curr_run = sb_lp_iterations - sb_lp_iterations_before_run;
    int64_t node_iters_curr_run = total_lp_iterations -
                                  total_lp_iterations_before_run -
                                  heur_iters_curr_run - sb_iters_curr_run;
    // now estimate the total fraction of LP iterations that we have spent on
    // heuristics by assuming the node iterations of the current run will
    // grow proportional to the pruned weight of the current tree and the
    // iterations spent for anything else are just added as an offset
    double total_heuristic_effort_estim =
        heuristic_lp_iterations /
        ((total_lp_iterations - node_iters_curr_run) +
         node_iters_curr_run / std::max(0.01, double(pruned_treeweight)));
    // since heuristics help most in the beginning of the search, we want to
    // spent the time we have for heuristics in the first 80% of the tree
    // exploration. Additionally we want to spent the proportional effort
    // of heuristics that is allowed in the first 30% of tree exploration as
    // fast as possible, which is why we have the max(0.3/0.8,...).
    // Hence, in the first 30% of the tree exploration we allow to spent all
    // effort available for heuristics in that part of the search as early as
    // possible, whereas after that we allow the part that is proportionally
    // adequate when we want to spent all available time in the first 80%.
    if (total_heuristic_effort_estim <
        std::max(0.3 / 0.8, std::min(double(pruned_treeweight), 0.8) / 0.8) *
            heuristic_effort) {
      // printf(
      //     "heuristic lp iterations: %ld, total_lp_iterations: %ld, "
      //     "total_heur_effort_estim = %.3f%%\n",
      //     heuristic_lp_iterations, total_lp_iterations,
      //     total_heuristic_effort_estim);
      return true;
    }
  }

  return false;
}